

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void check_forwarding(mock_allocator<int> *alloc,allocator_ref<mock_allocator<int>_> *ref)

{
  MockSpec<int_*(unsigned_long)> *this;
  TypedExpectation<int_*(unsigned_long)> *this_00;
  MockSpec<void_(int_*,_unsigned_long)> *this_01;
  int mem;
  undefined1 local_54 [4];
  Matcher<unsigned_long> local_50;
  Matcher<int_*> local_38;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_38,0x2a);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)alloc,alloc);
  this = testing::internal::FunctionMocker<int_*(unsigned_long)>::With
                   (&alloc->gmock1_allocate_20,(Matcher<unsigned_long> *)&local_38);
  this_00 = testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
                      (this,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                       ,0x109,"alloc","allocate(42)");
  local_50.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)operator_new(0x10);
  ((ActionInterface<int_*(unsigned_long)> *)
  local_50.super_MatcherBase<unsigned_long>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002a3338;
  ((ActionInterface<int_*(unsigned_long)> *)
  local_50.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       (_func_int **)local_54;
  local_50.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)&local_50.super_MatcherBase<unsigned_long>.impl_;
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            (this_00,(Action<int_*(unsigned_long)> *)&local_50);
  testing::internal::linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_> *)&local_50);
  local_38.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a1350;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
             &local_38.super_MatcherBase<int_*>.impl_);
  mock_allocator<int>::allocate(ref->alloc_,0x2a);
  testing::Matcher<int_*>::Matcher(&local_38,(int *)local_54);
  testing::Matcher<unsigned_long>::Matcher(&local_50,0x2a);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&alloc->gmock2_deallocate_21,alloc);
  this_01 = testing::internal::FunctionMocker<void_(int_*,_unsigned_long)>::With
                      (&alloc->gmock2_deallocate_21,&local_38,&local_50);
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x10b,"alloc","deallocate(ptr, 42)");
  local_50.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a1350;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_50.super_MatcherBase<unsigned_long>.impl_);
  local_38.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a1380;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int_*>_>::~linked_ptr
            (&local_38.super_MatcherBase<int_*>.impl_);
  mock_allocator<int>::deallocate(ref->alloc_,(Argument1)local_54,0x2a);
  return;
}

Assistant:

static void check_forwarding(
    mock_allocator<int> &alloc, allocator_ref<mock_allocator<int>> &ref) {
  int mem;
  // Check if value_type is properly defined.
  allocator_ref< mock_allocator<int> >::value_type *ptr = &mem;
  // Check forwarding.
  EXPECT_CALL(alloc, allocate(42)).WillOnce(testing::Return(ptr));
  ref.allocate(42);
  EXPECT_CALL(alloc, deallocate(ptr, 42));
  ref.deallocate(ptr, 42);
}